

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O1

csptr __thiscall pstack::Procman::LiveProcess::getAUXV(LiveProcess *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  csptr cVar1;
  LiveReader *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined1 local_21;
  
  local_38 = (LiveReader *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstack::Procman::LiveReader,std::allocator<pstack::Procman::LiveReader>,pstack::Context&,int_const&,char_const(&)[5]>
            (&local_30,&local_38,(allocator<pstack::Procman::LiveReader> *)&local_21,
             *(Context **)(in_RSI + 0xa0),(int *)(in_RSI + 0xb8),(char (*) [5])0x13340f);
  std::__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pstack::Procman::LiveReader,pstack::Procman::LiveReader>
            ((__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             local_38);
  (this->super_Process)._vptr_Process = (_func_int **)local_38;
  (this->super_Process).entry = 0;
  (this->super_Process).entry = (Addr)local_30._M_pi;
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (csptr)cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr LiveProcess::getAUXV() const {
    return std::make_shared<LiveReader>(context, pid, "auxv");
}